

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

void layout_objmenu(gamewin *gw)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  _func_void_gamewin_ptr *p_Var9;
  long lVar10;
  int iVar11;
  char weightstr [16];
  
  iVar2 = _COLS;
  iVar4 = _LINES;
  *(undefined4 *)((long)&gw[2].resize + 4) = 2;
  iVar6 = 2;
  if ((gw[1].next != (gamewin *)0x0) && (*(char *)&(gw[1].next)->draw != '\0')) {
    *(undefined4 *)((long)&gw[2].resize + 4) = 4;
    iVar6 = 4;
  }
  iVar11 = *(int *)&gw[1].prev;
  iVar3 = 0x34;
  if (iVar11 < 0x34) {
    iVar3 = iVar11;
  }
  iVar8 = iVar3 + iVar6;
  if (iVar4 <= iVar3 + iVar6) {
    iVar8 = iVar4;
  }
  *(int *)&gw[2].resize = iVar8;
  *(int *)&gw[2].win = iVar8 - iVar6;
  lVar10 = 0;
  lVar7 = 0;
  iVar6 = 0;
  do {
    if (iVar11 <= lVar7) {
      iVar4 = iVar2 + -4;
      if (iVar6 < iVar2 + -4) {
        iVar4 = iVar6;
      }
      *(int *)&gw[2].next = iVar4;
      *(int *)((long)&gw[2].win + 4) = iVar4 + 4;
      if ((gw[1].next != (gamewin *)0x0) &&
         (sVar5 = strlen((char *)gw[1].next), (ulong)(long)(iVar4 + 4) < sVar5 + 4)) {
        *(int *)&gw[2].next = (int)sVar5;
        *(int *)((long)&gw[2].win + 4) = (int)sVar5 + 4;
      }
      return;
    }
    p_Var9 = gw[1].resize;
    sVar5 = strlen((char *)(p_Var9 + lVar10));
    iVar4 = *(int *)(p_Var9 + lVar10 + 0x104);
    iVar11 = (int)sVar5 + 2;
    if (iVar4 != 1) {
      iVar11 = (int)sVar5;
    }
    if ((settings.invweight != '\0') && (*(int *)(p_Var9 + lVar10 + 0x118) != -1)) {
      sprintf(weightstr," {%d}");
      sVar5 = strlen(weightstr);
      iVar11 = iVar11 + (int)sVar5;
      p_Var9 = gw[1].resize;
      iVar4 = *(int *)(p_Var9 + lVar10 + 0x104);
    }
    if (iVar4 == 2) {
      cVar1 = (char)p_Var9[lVar10 + 0x121];
      iVar3 = iVar11 + 7;
LAB_0010dda3:
      if (cVar1 == '\0') {
        iVar3 = iVar11;
      }
    }
    else {
      iVar3 = iVar11;
      if (iVar4 == 1) {
        cVar1 = (char)p_Var9[lVar10 + 0x120];
        iVar3 = iVar11 + 4;
        goto LAB_0010dda3;
      }
    }
    if (iVar6 <= iVar3) {
      iVar6 = iVar3;
    }
    lVar7 = lVar7 + 1;
    iVar11 = *(int *)&gw[1].prev;
    lVar10 = lVar10 + 0x124;
  } while( true );
}

Assistant:

static void layout_objmenu(struct gamewin *gw)
{
    struct win_objmenu *mdat = (struct win_objmenu*)gw->extra;
    char weightstr[16];
    int i, maxwidth, itemwidth;
    int scrheight = LINES;
    int scrwidth = COLS;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    maxwidth = 0;
    for (i = 0; i < mdat->icount; i++) {
	itemwidth = strlen(mdat->items[i].caption);
	
	/* add extra space for an object symbol */
	if (mdat->items[i].role == MI_NORMAL)
	    itemwidth += 2;
	
	/* if the weight is known, leave space to show it */
	if (settings.invweight && mdat->items[i].weight != -1) {
	    sprintf(weightstr, " {%d}", mdat->items[i].weight);
	    itemwidth += strlen(weightstr);
	}
	if (mdat->items[i].role == MI_NORMAL && mdat->items[i].accel)
	    itemwidth += 4; /* "a - " */
	if (mdat->items[i].role == MI_HEADING && mdat->items[i].group_accel)
	    itemwidth += 7; /* "  (')')" */
	maxwidth = max(maxwidth, itemwidth);
    }
    
    mdat->innerwidth = maxwidth;
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}